

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void ecs_set_system_status_action
               (ecs_world_t *world,ecs_entity_t system,ecs_system_status_action_t action,void *ctx)

{
  _Bool _Var1;
  int32_t iVar2;
  void *pvVar3;
  
  pvVar3 = ecs_get_mut_w_entity(world,system,5,(_Bool *)0x0);
  _ecs_assert(pvVar3 != (void *)0x0,2,(char *)0x0,"system_data != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x150);
  if (pvVar3 == (void *)0x0) {
    __assert_fail("system_data != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x150,
                  "void ecs_set_system_status_action(ecs_world_t *, ecs_entity_t, ecs_system_status_action_t, const void *)"
                 );
  }
  *(ecs_system_status_action_t *)((long)pvVar3 + 0x28) = action;
  *(void **)((long)pvVar3 + 0x30) = ctx;
  _Var1 = ecs_has_entity(world,system,0x103);
  if (!_Var1) {
    if (*(code **)((long)pvVar3 + 0x28) != (code *)0x0) {
      (**(code **)((long)pvVar3 + 0x28))(world,system,1,*(undefined8 *)((long)pvVar3 + 0x30));
    }
    iVar2 = ecs_vector_count(*(ecs_vector_t **)(*(long *)((long)pvVar3 + 0x18) + 0x20));
    if ((iVar2 != 0) && (*(code **)((long)pvVar3 + 0x28) != (code *)0x0)) {
      (**(code **)((long)pvVar3 + 0x28))(world,system,3,*(undefined8 *)((long)pvVar3 + 0x30));
      return;
    }
  }
  return;
}

Assistant:

void ecs_set_system_status_action(
    ecs_world_t *world,
    ecs_entity_t system,
    ecs_system_status_action_t action,
    const void *ctx)
{
    EcsSystem *system_data = ecs_get_mut(world, system, EcsSystem, NULL);
    ecs_assert(system_data != NULL, ECS_INVALID_PARAMETER, NULL);

    system_data->status_action = action;
    system_data->status_ctx = (void*)ctx;

    if (!ecs_has_entity(world, system, EcsDisabled)) {
        /* If system is already enabled, generate enable status. The API 
         * should guarantee that it exactly matches enable-disable 
         * notifications and activate-deactivate notifications. */
        invoke_status_action(world, system, system_data, EcsSystemEnabled);

        /* If column system has active (non-empty) tables, also generate the
         * activate status. */
        if (ecs_vector_count(system_data->query->tables)) {
            invoke_status_action(
                world, system, system_data, EcsSystemActivated);
        }
    }
}